

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# do_wear.c
# Opt level: O3

void set_wear(void)

{
  if (uarmu != (obj *)0x0) {
    Shirt_on();
  }
  if (uarm != (obj *)0x0) {
    Armor_on();
  }
  if (uarmc != (obj *)0x0) {
    Cloak_on();
  }
  if (uarmf != (obj *)0x0) {
    Boots_on();
  }
  if (uarmg != (obj *)0x0) {
    Gloves_on();
  }
  if (uarmh != (obj *)0x0) {
    Helmet_on();
  }
  if (uarms != (obj *)0x0) {
    Shield_on();
    return;
  }
  return;
}

Assistant:

void set_wear(void)
{
	if (uarmu) Shirt_on();
	if (uarm)  Armor_on();
	if (uarmc) Cloak_on();
	if (uarmf) Boots_on();
	if (uarmg) Gloves_on();
	if (uarmh) Helmet_on();
	if (uarms) Shield_on();
}